

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

optional<pbrt::LightLeSample> * __thiscall
pbrt::PortalImageInfiniteLight::SampleLe
          (optional<pbrt::LightLeSample> *__return_storage_ptr__,PortalImageInfiniteLight *this,
          Point2f u1,Point2f u2,SampledWavelengths *lambda,Float time)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined8 uVar2;
  undefined1 auVar4 [16];
  bool bVar5;
  undefined1 auVar9 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 in_ZmmResult [64];
  undefined1 auVar14 [48];
  undefined1 auVar10 [64];
  undefined1 auVar12 [64];
  float fVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 in_XMM1_Qb;
  undefined1 auVar28 [60];
  undefined1 auVar26 [64];
  undefined1 auVar29 [56];
  undefined1 auVar27 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  SampledSpectrum SVar39;
  Vector3f VVar40;
  Float mapPDF;
  Float duv_dw;
  Bounds2f b;
  float local_ec;
  undefined1 local_e8 [8];
  undefined8 uStack_e0;
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  float local_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  Tuple2<pbrt::Point2,_float> local_38;
  Bounds2f local_30;
  undefined1 auVar11 [64];
  undefined1 auVar13 [64];
  undefined1 extraout_var [56];
  undefined1 auVar23 [56];
  
  auVar14 = in_ZmmResult._16_48_;
  auVar19._8_56_ = in_register_00001208;
  auVar19._0_8_ = u1.super_Tuple2<pbrt::Point2,_float>;
  uStack_e0 = in_XMM1_Qb;
  local_e8 = (undefined1  [8])u2.super_Tuple2<pbrt::Point2,_float>;
  auVar18._8_4_ = 0x3f800000;
  auVar18._0_8_ = 0x3f8000003f800000;
  auVar18._12_4_ = 0x3f800000;
  local_38 = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar19._0_16_);
  local_30 = (Bounds2f)vmovlhps_avx(ZEXT816(0) << 0x40,auVar18);
  auVar20._0_8_ =
       WindowedPiecewiseConstant2D::Sample
                 (&this->distribution,(Point2f *)&local_38,&local_30,&local_ec);
  auVar20._8_56_ = extraout_var;
  auVar28 = (undefined1  [60])0x0;
  if ((local_ec == 0.0) && (!NAN(local_ec))) {
LAB_0035ed17:
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = 0;
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
    return __return_storage_ptr__;
  }
  local_48 = auVar20._0_16_;
  auVar23 = extraout_var;
  VVar40 = RenderFromImage(this,auVar20._0_8_,&local_ac);
  auVar26._0_4_ = VVar40.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar26._4_60_ = auVar28;
  auVar21._0_8_ = VVar40.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar21._8_56_ = auVar23;
  auVar18 = auVar21._0_16_;
  if ((local_ac == 0.0) && (!NAN(local_ac))) goto LAB_0035ed17;
  auVar24 = auVar26._0_16_;
  fVar34 = VVar40.super_Tuple3<pbrt::Vector3,_float>.x;
  local_58._0_8_ = auVar21._0_8_ ^ 0x8000000080000000;
  local_58._8_4_ = -auVar23._0_4_;
  local_58._12_4_ = -auVar23._4_4_;
  local_68 = -auVar26._0_4_;
  uStack_64 = auVar28._0_4_ ^ 0x80000000;
  uStack_60 = auVar28._4_4_ ^ 0x80000000;
  uStack_5c = auVar28._8_4_ ^ 0x80000000;
  auVar8._8_4_ = 0x80000000;
  auVar8._0_8_ = 0x8000000080000000;
  auVar8._12_4_ = 0x80000000;
  auVar6._8_4_ = 0x3f800000;
  auVar6._0_8_ = 0x3f8000003f800000;
  auVar6._12_4_ = 0x3f800000;
  auVar6 = vpternlogd_avx512vl(auVar6,auVar24,auVar8,0xf8);
  fVar15 = auVar6._0_4_;
  auVar25._0_4_ = -1.0 / (auVar26._0_4_ + fVar15);
  auVar9 = vmovshdup_avx(auVar18);
  fVar16 = fVar34 * auVar9._0_4_ * auVar25._0_4_;
  _local_d8 = ZEXT416((uint)(fVar15 * fVar16));
  auVar30._0_4_ = fVar34 * fVar34 * fVar15;
  auVar30._4_4_ = VVar40.super_Tuple3<pbrt::Vector3,_float>.y * 0.0;
  auVar30._8_4_ = auVar23._0_4_ * 0.0;
  auVar30._12_4_ = auVar23._4_4_ * 0.0;
  auVar25._4_4_ = auVar25._0_4_;
  auVar25._8_4_ = auVar25._0_4_;
  auVar25._12_4_ = auVar25._0_4_;
  auVar33._8_4_ = 0x3f800000;
  auVar33._0_8_ = 0x3f8000003f800000;
  auVar33._12_4_ = 0x3f800000;
  auVar9 = vunpcklps_avx(auVar33,auVar6);
  auVar6 = vfmadd231ps_fma(auVar9,auVar30,auVar25);
  auVar7._0_4_ = (float)local_e8._0_4_ + (float)local_e8._0_4_;
  auVar7._4_4_ = (float)local_e8._4_4_ + (float)local_e8._4_4_;
  auVar7._8_4_ = (float)uStack_e0 + (float)uStack_e0;
  auVar7._12_4_ = uStack_e0._4_4_ + uStack_e0._4_4_;
  auVar9._8_4_ = 0xbf800000;
  auVar9._0_8_ = 0xbf800000bf800000;
  auVar9._12_4_ = 0xbf800000;
  auVar7 = vaddps_avx512vl(auVar7,auVar9);
  auVar9 = vmovshdup_avx(auVar7);
  fVar35 = auVar7._0_4_;
  fVar17 = auVar9._0_4_;
  if (fVar35 == 0.0) {
    auVar25 = ZEXT416(0) << 0x20;
    if ((fVar17 == 0.0) && (auVar8 = ZEXT416((uint)fVar16), !NAN(fVar17))) goto LAB_0035eee7;
  }
  auVar4._8_4_ = 0x7fffffff;
  auVar4._0_8_ = 0x7fffffff7fffffff;
  auVar4._12_4_ = 0x7fffffff;
  auVar8 = vandps_avx512vl(auVar7,auVar4);
  auVar25 = vshufps_avx(auVar8,auVar8,0xf5);
  bVar5 = auVar25._0_4_ < auVar8._0_4_;
  auVar31._0_4_ = fVar35 / fVar17;
  auVar31._4_12_ = auVar7._4_12_;
  auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar31,ZEXT416(0x3fc90fdb));
  auVar11._16_48_ = auVar14;
  auVar11._0_16_ = auVar7;
  auVar10._4_60_ = auVar11._4_60_;
  auVar10._0_4_ =
       (float)((uint)bVar5 * (int)((fVar17 / fVar35) * 0.7853982) + (uint)!bVar5 * auVar7._0_4_);
  local_a8 = auVar10._0_16_;
  auVar13._16_48_ = auVar14;
  auVar13._0_16_ = auVar9;
  auVar12._4_60_ = auVar13._4_60_;
  auVar12._0_4_ = (uint)bVar5 * (int)fVar35 + (uint)!bVar5 * (int)fVar17;
  local_98 = auVar12._0_16_;
  _local_d8 = ZEXT416((uint)(fVar15 * fVar16));
  local_78 = ZEXT416((uint)fVar16);
  _local_e8 = auVar18;
  local_c8 = auVar24;
  local_88 = auVar6;
  fVar16 = cosf(auVar10._0_4_);
  fVar17 = sinf((float)local_a8._0_4_);
  auVar25 = vinsertps_avx(ZEXT416((uint)((float)local_98._0_4_ * fVar16)),
                          ZEXT416((uint)((float)local_98._0_4_ * fVar17)),0x10);
  auVar18 = _local_e8;
  auVar8 = local_78;
  auVar6 = local_88;
  auVar24 = local_c8;
LAB_0035eee7:
  fVar17 = auVar25._0_4_;
  fVar35 = auVar18._0_4_;
  auVar32._0_4_ = fVar35 * fVar17;
  fVar36 = auVar18._4_4_;
  auVar32._4_4_ = fVar36 * auVar25._4_4_;
  fVar37 = auVar18._8_4_;
  auVar32._8_4_ = fVar37 * auVar25._8_4_;
  fVar38 = auVar18._12_4_;
  auVar32._12_4_ = fVar38 * auVar25._12_4_;
  auVar18 = vmovshdup_avx(auVar32);
  fVar16 = this->sceneRadius;
  local_e8._0_4_ =
       auVar24._0_4_ * fVar16 +
       fVar16 * (auVar24._0_4_ * 0.0 + (fVar34 * -fVar15 * fVar17 - auVar18._0_4_)) +
       (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.z;
  auVar9 = vpermt2ps_avx512vl(_local_d8,_DAT_00565640,auVar8);
  auVar18 = vshufps_avx(auVar25,auVar25,0xe1);
  uVar1 = (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.x;
  uVar3 = (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.y;
  local_d8._4_4_ =
       fVar36 * fVar16 +
       (float)uVar3 +
       fVar16 * (fVar36 * 0.0 + auVar9._4_4_ * auVar18._4_4_ + auVar6._4_4_ * auVar25._4_4_);
  local_d8._0_4_ =
       fVar35 * fVar16 +
       (float)uVar1 + fVar16 * (fVar35 * 0.0 + auVar9._0_4_ * auVar18._0_4_ + auVar6._0_4_ * fVar17)
  ;
  fStack_d0 = fVar37 * fVar16 +
              fVar16 * (fVar37 * 0.0 + auVar9._8_4_ * auVar18._8_4_ + auVar6._8_4_ * auVar25._8_4_)
              + 0.0;
  fStack_cc = fVar38 * fVar16 +
              fVar16 * (fVar38 * 0.0 +
                       auVar9._12_4_ * auVar18._12_4_ + auVar6._12_4_ * auVar25._12_4_) + 0.0;
  auVar29 = (undefined1  [56])0x0;
  local_c8._0_4_ = 1.0 / (fVar16 * fVar16 * 3.1415927);
  auVar23 = ZEXT856((ulong)local_48._8_8_);
  SVar39 = ImageLookup(this,(Point2f)local_48._0_8_,lambda);
  auVar27._0_8_ = SVar39.values.values._8_8_;
  auVar27._8_56_ = auVar29;
  auVar22._0_8_ = SVar39.values.values._0_8_;
  auVar22._8_56_ = auVar23;
  __return_storage_ptr__->set = true;
  auVar18 = vmovlhps_avx(auVar22._0_16_,auVar27._0_16_);
  *(undefined1 (*) [16])&__return_storage_ptr__->optionalValue = auVar18;
  uVar2 = vmovlps_avx(_local_d8);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar2;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = local_e8._0_4_;
  uVar2 = vmovlps_avx(local_58);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = uVar2;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x24) = local_68;
  *(Float *)((long)&__return_storage_ptr__->optionalValue + 0x28) = time;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
  (__return_storage_ptr__->optionalValue).__data[0x88] = '\0';
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = local_c8._0_4_;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x94) = local_ec / local_ac;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightLeSample> PortalImageInfiniteLight::SampleLe(
    Point2f u1, Point2f u2, SampledWavelengths &lambda, Float time) const {
    Float mapPDF;
    Bounds2f b(Point2f(0, 0), Point2f(1, 1));
    Point2f uv = distribution.Sample(u1, b, &mapPDF);
    if (mapPDF == 0)
        return {};

    // Convert infinite light sample point to direction
    // Note: ignore WorldToLight since we already folded it in when we
    // resampled...
    Float duv_dw;
    Vector3f w = -RenderFromImage(uv, &duv_dw);
    if (duv_dw == 0)
        return {};

    // Compute PDF for sampled infinite light direction
    Float pdfDir = mapPDF / duv_dw;

#if 0
    // Just sample within the portal.
    // This works with the light path integrator, but not BDPT :-(
    Point3f p = portal[0] + u2[0] * (portal[1] - portal[0]) +
        u2[1] * (portal[3] - portal[0]);
    // Compute _PortalImageInfiniteLight_ ray PDFs
    Ray ray(p, w, time);

    // Cosine to account for projected area of portal w.r.t. ray direction.
    Normal3f n = Normal3f(portalFrame.z);
    Float pdfPos = 1 / (Area() * AbsDot(n, w));
#else
    // Compute infinite light sample ray
    Frame wFrame = Frame::FromZ(-w);
    Point2f cd = SampleUniformDiskConcentric(u2);
    Point3f pDisk = sceneCenter + sceneRadius * wFrame.FromLocal(Vector3f(cd.x, cd.y, 0));
    Ray ray(pDisk + sceneRadius * -w, w, time);

    Float pdfPos = 1 / (Pi * Sqr(sceneRadius));
#endif

    SampledSpectrum L = ImageLookup(uv, lambda);

    return LightLeSample(L, ray, pdfPos, pdfDir);
}